

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

optional<wallet::MigrationData> * __thiscall
wallet::CWallet::GetDescriptorsForLegacy
          (optional<wallet::MigrationData> *__return_storage_ptr__,CWallet *this,
          bilingual_str *error)

{
  string_view func;
  string original;
  LegacyDataSPKM *this_00;
  long in_FS_OFFSET;
  string_view msg;
  string_view file;
  undefined8 uVar1;
  char *pcVar2;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 uVar3;
  bilingual_str local_130;
  optional<wallet::MigrationData> res;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = GetLegacyDataSPKM(this);
  if (this_00 == (LegacyDataSPKM *)0x0) {
    uVar3 = 0x17;
    uVar1 = 0x17;
    pcVar2 = "GetDescriptorsForLegacy";
    func._M_str = "GetDescriptorsForLegacy";
    func._M_len = 0x17;
    msg._M_str = "Error: Legacy wallet data missing";
    msg._M_len = 0x21;
    file._M_str = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp";
    file._M_len = 0x5a;
    StrFormatInternalBug_abi_cxx11_(&local_40,msg,file,0xfc6,func);
    original._M_string_length = (size_type)pcVar2;
    original._M_dataplus._M_p = (pointer)uVar1;
    original.field_2._M_allocated_capacity = in_stack_fffffffffffffeb8;
    original.field_2._8_8_ = uVar3;
    Untranslated((bilingual_str *)&res,original);
    bilingual_str::operator=(error,(bilingual_str *)&res);
    bilingual_str::~bilingual_str((bilingual_str *)&res);
    std::__cxx11::string::~string((string *)&local_40);
    (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload.
    super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
    super__Optional_payload_base<wallet::MigrationData>._M_engaged = false;
  }
  else {
    LegacyDataSPKM::MigrateToDescriptor(&res,this_00);
    if (res.super__Optional_base<wallet::MigrationData,_false,_false>._M_payload.
        super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
        super__Optional_payload_base<wallet::MigrationData>._M_engaged == false) {
      _(&local_130,(ConstevalStringLiteral)0xe1d4c3);
      bilingual_str::operator=(error,&local_130);
      bilingual_str::~bilingual_str(&local_130);
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_engaged = false;
    }
    else {
      std::_Optional_base<wallet::MigrationData,_false,_false>::_Optional_base
                (&__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>,
                 &res.super__Optional_base<wallet::MigrationData,_false,_false>);
    }
    std::_Optional_payload_base<wallet::MigrationData>::_M_reset
              ((_Optional_payload_base<wallet::MigrationData> *)&res);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<MigrationData> CWallet::GetDescriptorsForLegacy(bilingual_str& error) const
{
    AssertLockHeld(cs_wallet);

    LegacyDataSPKM* legacy_spkm = GetLegacyDataSPKM();
    if (!Assume(legacy_spkm)) {
        // This shouldn't happen
        error = Untranslated(STR_INTERNAL_BUG("Error: Legacy wallet data missing"));
        return std::nullopt;
    }

    std::optional<MigrationData> res = legacy_spkm->MigrateToDescriptor();
    if (res == std::nullopt) {
        error = _("Error: Unable to produce descriptors for this legacy wallet. Make sure to provide the wallet's passphrase if it is encrypted.");
        return std::nullopt;
    }
    return res;
}